

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TransSetSyntax *pTVar1;
  Token TVar2;
  Token TVar3;
  BumpAllocator *in_stack_00000108;
  SeparatedSyntaxList<slang::syntax::TransRangeSyntax> *in_stack_00000110;
  
  TVar2 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::TransRangeSyntax>(in_stack_00000110,in_stack_00000108);
  TVar3 = parsing::Token::deepClone((Token *)in_stack_00000110,in_stack_00000108);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TransSetSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::TransRangeSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      (Token *)TVar3.info);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TransSetSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TransSetSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone(node.ranges, alloc),
        node.closeParen.deepClone(alloc)
    );
}